

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

bool __thiscall EDLines::ValidateLineSegmentRect(EDLines *this,int *x,int *y,LineSegment *ls)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double diff;
  double pixelAngle;
  int gy;
  int gx;
  int com2;
  int com1;
  int c;
  int r;
  int i;
  int aligned;
  int count;
  int noPoints;
  double lineAngle;
  LineSegment *ls_local;
  int *y_local;
  int *x_local;
  EDLines *this_local;
  
  lineAngle = (double)ls;
  ls_local = (LineSegment *)y;
  y_local = x;
  x_local = (int *)this;
  if (ls->invert == 0) {
    _count = atan(ls->b);
  }
  else {
    _count = atan(1.0 / ls->b);
  }
  if (_count < 0.0) {
    _count = _count + 3.141592653589793;
  }
  aligned = 0;
  EnumerateRectPoints(*(double *)((long)lineAngle + 0x18),*(double *)((long)lineAngle + 0x20),
                      *(double *)((long)lineAngle + 0x28),*(double *)((long)lineAngle + 0x30),
                      y_local,(int *)ls_local,&aligned);
  i = 0;
  r = 0;
  for (c = 0; c < aligned; c = c + 1) {
    iVar1 = *(int *)((long)&ls_local->a + (long)c * 4);
    iVar2 = y_local[c];
    if ((((0 < iVar1) && (iVar1 < (this->super_ED).height + -1)) && (0 < iVar2)) &&
       (iVar2 < (this->super_ED).width + -1)) {
      i = i + 1;
      iVar4 = (uint)(this->super_ED).srcImg[(iVar1 + 1) * (this->super_ED).width + iVar2 + 1] -
              (uint)(this->super_ED).srcImg[(iVar1 + -1) * (this->super_ED).width + iVar2 + -1];
      iVar5 = (uint)(this->super_ED).srcImg[(iVar1 + -1) * (this->super_ED).width + iVar2 + 1] -
              (uint)(this->super_ED).srcImg[(iVar1 + 1) * (this->super_ED).width + iVar2 + -1];
      dVar6 = NFALUT::myAtan2((double)(int)((iVar4 + iVar5 +
                                            (uint)(this->super_ED).srcImg
                                                  [iVar1 * (this->super_ED).width + iVar2 + 1]) -
                                           (uint)(this->super_ED).srcImg
                                                 [iVar1 * (this->super_ED).width + iVar2 + -1]),
                              (double)(int)-(((iVar4 - iVar5) +
                                             (uint)(this->super_ED).srcImg
                                                   [(iVar1 + 1) * (this->super_ED).width + iVar2]) -
                                            (uint)(this->super_ED).srcImg
                                                  [(iVar1 + -1) * (this->super_ED).width + iVar2]));
      if ((ABS(_count - dVar6) <= this->prec) ||
         (3.141592653589793 - this->prec <= ABS(_count - dVar6))) {
        r = r + 1;
      }
    }
  }
  bVar3 = NFALUT::checkValidationByNFA(this->nfa,i,r);
  return bVar3;
}

Assistant:

bool EDLines::ValidateLineSegmentRect(int * x, int * y, LineSegment * ls)
{

	// Compute Line's angle
	double lineAngle;

	if (ls->invert == 0) {
		// y = a + bx
		lineAngle = atan(ls->b);

	}
	else {
		// x = a + by
		lineAngle = atan(1.0 / ls->b);
	} //end-else

	if (lineAngle < 0) lineAngle += M_PI;

	int noPoints = 0;

	// Enumerate all pixels that fall within the bounding rectangle
	EnumerateRectPoints(ls->sx, ls->sy, ls->ex, ls->ey, x, y, &noPoints);

	int count = 0;
	int aligned = 0;

	for (int i = 0; i<noPoints; i++) {
		int r = y[i];
		int c = x[i];

		if (r <= 0 || r >= height - 1 || c <= 0 || c >= width - 1) continue;

		count++;

		// compute gx & gy using the simple [-1 -1 -1]
		//                                  [ 1  1  1]  filter in both directions
		// Faster method below
		// A B C
		// D x E
		// F G H
		// gx = (C-A) + (E-D) + (H-F)
		// gy = (F-A) + (G-B) + (H-C)
		//
		// To make this faster: 
		// com1 = (H-A)
		// com2 = (C-F)
		// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
		//       gy = com2 - com1 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
		// 
		int com1 = srcImg[(r + 1)*width + c + 1] - srcImg[(r - 1)*width + c - 1];
		int com2 = srcImg[(r - 1)*width + c + 1] - srcImg[(r + 1)*width + c - 1];

		int gx = com1 + com2 + srcImg[r*width + c + 1] - srcImg[r*width + c - 1];
		int gy = com1 - com2 + srcImg[(r + 1)*width + c] - srcImg[(r - 1)*width + c];
		double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);
		
		double diff = fabs(lineAngle - pixelAngle);

		if (diff <= prec || diff >= M_PI - prec) aligned++;
	} //end-for

	return nfa->checkValidationByNFA(count, aligned);
}